

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O3

void __thiscall
lemon::
VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>::
erase(VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
      *this,vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
            *keys)

{
  ulong *puVar1;
  int iVar2;
  pointer pNVar3;
  _Bit_type *p_Var4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  
  pNVar3 = (keys->
           super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (uint)((ulong)((long)(keys->
                               super__Vector_base<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pNVar3) >> 2);
  if (0 < (int)uVar6) {
    p_Var4 = (this->container).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    uVar7 = 0;
    do {
      iVar2 = pNVar3[uVar7]._id;
      iVar8 = iVar2 + 0x3f;
      if (-1 < (long)iVar2) {
        iVar8 = iVar2;
      }
      bVar5 = (byte)iVar2 & 0x3f;
      puVar1 = p_Var4 + (long)(iVar8 >> 6) +
                        (ulong)(((long)iVar2 & 0x800000000000003fU) < 0x8000000000000001) +
                        0xffffffffffffffff;
      *puVar1 = *puVar1 & (-2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5);
      uVar7 = uVar7 + 1;
    } while ((uVar6 & 0x7fffffff) != uVar7);
  }
  return;
}

Assistant:

virtual void erase(const std::vector<Key>& keys) {
    for (int i = 0; i < int(keys.size()); ++i) {
      container[Parent::notifier()->id(keys[i])] = Value();
    }
  }